

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O2

void __thiscall
TPZMeshSolution::TPZMeshSolution(TPZMeshSolution *this,void **vtt,TPZCompMesh *cmesh,int materialid)

{
  TPZFunction<double> TVar1;
  long lVar2;
  int iVar3;
  TPZMaterial *pTVar4;
  TPZGeoEl *pTVar5;
  long lVar6;
  long lVar7;
  long iel;
  allocator<char> local_51;
  double local_50 [4];
  
  TVar1 = *(TPZFunction<double> *)(vtt + 1);
  this->super_TPZFunction<double> = TVar1;
  *(void **)((long)(this->fLastLoc).fExtAlloc + *(long *)((long)TVar1 + -0x60) + -0x38) = vtt[2];
  TVar1 = (TPZFunction<double>)*vtt;
  this->super_TPZFunction<double> = TVar1;
  *(void **)((long)(this->fLastLoc).fExtAlloc + *(long *)((long)TVar1 + -0x60) + -0x38) = vtt[3];
  this->fMesh = cmesh;
  TPZManVector<double,_3>::TPZManVector(&this->fLastLoc,0);
  this->fMaterialIndex = materialid;
  iVar3 = cmesh->fDimModel;
  this->fDimension = iVar3;
  local_50[0] = 0.0;
  TPZManVector<double,_3>::Resize(&this->fLastLoc,(long)iVar3,local_50);
  pTVar4 = TPZCompMesh::FindMaterial(cmesh,materialid);
  if (pTVar4 == (TPZMaterial *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/TPZMeshSolution.cpp"
               ,0x26);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"Pressure",&local_51);
  iVar3 = (**(code **)(*(long *)pTVar4 + 0x80))(pTVar4,local_50);
  this->fSolutionVarindex = iVar3;
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"Derivative",&local_51);
  iVar3 = (**(code **)(*(long *)pTVar4 + 0x80))(pTVar4,local_50);
  this->fGradVarindex = iVar3;
  std::__cxx11::string::~string((string *)local_50);
  iVar3 = (**(code **)(*(long *)pTVar4 + 0x88))(pTVar4,this->fSolutionVarindex);
  this->fNumSolutions = iVar3;
  lVar2 = (cmesh->fReference->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  iel = 0;
  lVar6 = 0;
  if (0 < lVar2) {
    lVar6 = lVar2;
  }
  while ((lVar7 = lVar6, lVar6 != iel &&
         ((pTVar5 = TPZGeoMesh::Element(this->fMesh->fReference,iel), pTVar5 == (TPZGeoEl *)0x0 ||
          (iVar3 = (**(code **)(*(long *)pTVar5 + 0x210))(pTVar5), lVar7 = iel,
          iVar3 != this->fDimension))))) {
    iel = iel + 1;
  }
  if (lVar7 != lVar2) {
    this->fGeoElIndex = lVar7;
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/TPZMeshSolution.cpp"
             ,0x34);
}

Assistant:

TPZMeshSolution::TPZMeshSolution(TPZCompMesh *cmesh, int materialid) : 
TPZRegisterClassId(&TPZMeshSolution::ClassId),
fMesh(cmesh), fMaterialIndex(materialid)
{
    fDimension = cmesh->Dimension();
    fLastLoc.Resize(fDimension,0.);
    TPZMaterial *material = cmesh->FindMaterial(materialid);
    if (!material) {
        DebugStop();
    }
    fSolutionVarindex = material->VariableIndex("Pressure");
    fGradVarindex = material->VariableIndex("Derivative");
    fNumSolutions = material->NSolutionVariables(fSolutionVarindex);
    int64_t nel = cmesh->Reference()->NElements();
    int64_t el;
    for (el=0; el<nel; el++) {
        TPZGeoEl *gel = fMesh->Reference()->Element(el);
        if (gel && gel->Dimension() == fDimension) {
            break;
        }
    }
    if (el==nel) {
        DebugStop();
    }
    fGeoElIndex = el;
}